

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpFactory.cpp
# Opt level: O3

CharOp * __thiscall xercesc_4_0::OpFactory::createCaptureOp(OpFactory *this,int number,Op *next)

{
  BaseRefVectorOf<xercesc_4_0::Op> *this_00;
  XMLSize_t XVar1;
  CharOp *this_01;
  
  this_01 = (CharOp *)XMemory::operator_new(0x28,this->fMemoryManager);
  CharOp::CharOp(this_01,O_CAPTURE,number,this->fMemoryManager);
  (this_01->super_Op).fNextOp = next;
  this_00 = &this->fOpVector->super_BaseRefVectorOf<xercesc_4_0::Op>;
  BaseRefVectorOf<xercesc_4_0::Op>::ensureExtraCapacity(this_00,1);
  XVar1 = this_00->fCurCount;
  this_00->fElemList[XVar1] = (Op *)this_01;
  this_00->fCurCount = XVar1 + 1;
  return this_01;
}

Assistant:

CharOp* OpFactory::createCaptureOp(int number, const Op* const next) {

    CharOp* tmpOp = new (fMemoryManager) CharOp(Op::O_CAPTURE, number, fMemoryManager);

    tmpOp->setNextOp(next);
    fOpVector->addElement(tmpOp);
    return tmpOp;
}